

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_sgemm_pack16to1.h
# Opt level: O3

void ncnn::convolution_im2col_sgemm_transform_kernel_pack16to1_avx512
               (Mat *_kernel,Mat *kernel_tm,int inch,int outch,int kernel_w,int kernel_h)

{
  void *pvVar1;
  size_t sVar2;
  size_t sVar3;
  uint uVar4;
  undefined4 *puVar5;
  ulong uVar6;
  int iVar7;
  uint _w;
  long lVar8;
  ulong uVar9;
  long lVar10;
  void *pvVar11;
  undefined4 *puVar12;
  undefined4 *puVar13;
  int k_1;
  long lVar14;
  void *pvVar15;
  undefined4 *puVar16;
  ulong local_b0;
  Mat local_78;
  
  _w = kernel_w * kernel_h;
  uVar9 = 0;
  Mat::reshape(&local_78,_kernel,_w,inch,outch,(Allocator *)0x0);
  iVar7 = inch + 0xf;
  if (-1 < inch) {
    iVar7 = inch;
  }
  uVar4 = outch + 7;
  if (-1 < outch) {
    uVar4 = outch;
  }
  Mat::create(kernel_tm,_w * 0x80,iVar7 >> 4,(((int)uVar4 >> 3) - (uVar4 & 0xfffffff8)) + outch,4,
              (Allocator *)0x0);
  if (7 < outch) {
    pvVar1 = kernel_tm->data;
    sVar2 = kernel_tm->cstep;
    sVar3 = kernel_tm->elemsize;
    local_b0 = 0;
    do {
      if (0xf < inch) {
        pvVar15 = (void *)((local_b0 >> 3) * sVar2 * sVar3 + (long)pvVar1);
        puVar5 = (undefined4 *)(local_78.cstep * local_78.elemsize * local_b0 + (long)local_78.data)
        ;
        lVar8 = 0;
        do {
          if (0 < (int)_w) {
            uVar9 = 0;
            puVar13 = puVar5;
            do {
              lVar10 = 0;
              puVar12 = puVar13;
              do {
                pvVar11 = pvVar15;
                lVar14 = 0;
                puVar16 = puVar12;
                do {
                  *(undefined4 *)((long)pvVar11 + lVar14) = *puVar16;
                  puVar16 = (undefined4 *)((long)puVar16 + local_78.cstep * local_78.elemsize);
                  lVar14 = lVar14 + 4;
                } while (lVar14 != 0x20);
                lVar10 = lVar10 + 1;
                puVar12 = (undefined4 *)((long)puVar12 + (long)local_78.w * local_78.elemsize);
                pvVar15 = (void *)((long)pvVar11 + 0x20);
              } while (lVar10 != 0x10);
              uVar9 = uVar9 + 1;
              puVar13 = puVar13 + 1;
              pvVar15 = (void *)((long)pvVar11 + 0x20);
            } while (uVar9 != _w);
            pvVar15 = (void *)((long)pvVar11 + 0x20);
          }
          lVar10 = lVar8 + 0x1f;
          puVar5 = puVar5 + (long)local_78.w * local_78.elemsize * 4;
          lVar8 = lVar8 + 0x10;
        } while (lVar10 < inch);
      }
      uVar9 = local_b0 + 8;
      uVar6 = local_b0 + 0xf;
      local_b0 = uVar9;
    } while (uVar6 < (uint)outch);
  }
  if ((int)uVar9 < outch) {
    sVar2 = kernel_tm->cstep;
    sVar3 = kernel_tm->elemsize;
    uVar9 = uVar9 & 0xffffffff;
    puVar5 = (undefined4 *)(local_78.cstep * local_78.elemsize * uVar9 + (long)local_78.data);
    pvVar1 = kernel_tm->data;
    do {
      if (0xf < inch) {
        pvVar15 = (void *)((ulong)(((uint)uVar9 & 7) + ((uint)(uVar9 >> 3) & 0x1fffffff)) *
                           sVar2 * sVar3 + (long)pvVar1);
        puVar13 = puVar5;
        lVar8 = 0;
        do {
          if (0 < (int)_w) {
            uVar6 = 0;
            puVar12 = puVar13;
            do {
              pvVar11 = pvVar15;
              lVar10 = 0;
              puVar16 = puVar12;
              do {
                *(undefined4 *)((long)pvVar11 + lVar10) = *puVar16;
                puVar16 = (undefined4 *)((long)puVar16 + (long)local_78.w * local_78.elemsize);
                lVar10 = lVar10 + 4;
              } while (lVar10 != 0x40);
              uVar6 = uVar6 + 1;
              puVar12 = puVar12 + 1;
              pvVar15 = (void *)((long)pvVar11 + 0x40);
            } while (uVar6 != _w);
            pvVar15 = (void *)((long)pvVar11 + 0x40);
          }
          lVar10 = lVar8 + 0x1f;
          puVar13 = puVar13 + (long)local_78.w * local_78.elemsize * 4;
          lVar8 = lVar8 + 0x10;
        } while (lVar10 < inch);
      }
      uVar9 = uVar9 + 1;
      puVar5 = (undefined4 *)((long)puVar5 + local_78.cstep * local_78.elemsize);
    } while (uVar9 != (uint)outch);
  }
  if (local_78.refcount != (int *)0x0) {
    LOCK();
    *local_78.refcount = *local_78.refcount + -1;
    UNLOCK();
    if (*local_78.refcount == 0) {
      if (local_78.allocator == (Allocator *)0x0) {
        if (local_78.data != (void *)0x0) {
          free(local_78.data);
        }
      }
      else {
        (*(local_78.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return;
}

Assistant:

static void convolution_im2col_sgemm_transform_kernel_pack16to1_avx512(const Mat& _kernel, Mat& kernel_tm, int inch, int outch, int kernel_w, int kernel_h)
{
    const int maxk = kernel_w * kernel_h;

    // interleave
    // src = maxk-inch-outch
    // dst = pb-pa-maxk-inch/pa-outch/pb
    Mat kernel = _kernel.reshape(maxk, inch, outch);
    kernel_tm.create(8 * 16 * maxk, inch / 16, outch / 8 + outch % 8);

    int q = 0;
    for (; q + 7 < outch; q += 8)
    {
        float* g00 = kernel_tm.channel(q / 8);

        for (int p = 0; p + 15 < inch; p += 16)
        {
            for (int k = 0; k < maxk; k++)
            {
                for (int i = 0; i < 16; i++)
                {
                    for (int j = 0; j < 8; j++)
                    {
                        const float* k00 = kernel.channel(q + j).row(p + i);
                        g00[0] = k00[k];
                        g00++;
                    }
                }
            }
        }
    }
    for (; q < outch; q++)
    {
        const Mat k0 = kernel.channel(q);

        float* g00 = kernel_tm.channel(q / 8 + q % 8);

        for (int p = 0; p + 15 < inch; p += 16)
        {
            for (int k = 0; k < maxk; k++)
            {
                for (int i = 0; i < 16; i++)
                {
                    const float* k00 = k0.row(p + i);
                    g00[0] = k00[k];
                    g00++;
                }
            }
        }
    }
}